

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O2

int __thiscall
H264StreamReader::detectPrimaryPicType(H264StreamReader *this,SliceUnit *firstSlice,uint8_t *buff)

{
  bool bVar1;
  int iVar2;
  byte *buffer;
  byte *end;
  SliceUnit slice;
  
  SliceUnit::SliceUnit(&slice);
  *(undefined2 *)&(this->super_MPEGStreamReader).field_0xda = 0;
  this->m_pict_type = -1;
  iVar2 = sliceTypeToPictType(this,firstSlice->slice_type);
  this->m_pict_type = iVar2;
  buffer = NALUnit::findNextNAL
                     (buff,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
  end = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
  if (buffer != end) {
    do {
      if (((*buffer & 0x1f) < 0x15) && ((0x10003eU >> (*buffer & 0x1f) & 1) != 0)) {
        iVar2 = SliceUnit::deserializeSliceType(&slice,buffer,end);
        if (iVar2 != 0) break;
        if (slice.first_mb_in_slice == 0) {
          (this->super_MPEGStreamReader).field_0xda = 1;
          bVar1 = SliceUnit::isIDR(&slice);
          (this->super_MPEGStreamReader).field_0xdb = bVar1;
          iVar2 = 0;
          goto LAB_0019bd2b;
        }
        iVar2 = sliceTypeToPictType(this,slice.slice_type);
        if (iVar2 < this->m_pict_type) {
          iVar2 = this->m_pict_type;
        }
        this->m_pict_type = iVar2;
        end = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
      }
      buffer = NALUnit::findNextNAL(buffer,end);
      end = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
    } while (buffer != end);
  }
  iVar2 = -10;
  if ((this->super_MPEGStreamReader).m_eof != false) {
    iVar2 = 0;
  }
LAB_0019bd2b:
  NALUnit::~NALUnit(&slice.super_NALUnit);
  return iVar2;
}

Assistant:

int H264StreamReader::detectPrimaryPicType(const SliceUnit &firstSlice, uint8_t *buff)
{
    SliceUnit slice;
    m_nextFrameFound = false;
    m_nextFrameIdr = false;
    m_pict_type = -1;
    m_pict_type = (std::max)(m_pict_type, sliceTypeToPictType(firstSlice.slice_type));

    uint8_t *nextSlice = NALUnit::findNextNAL(buff, m_bufEnd);
    if (nextSlice == m_bufEnd)
    {
        return m_eof ? 0 : NOT_ENOUGH_BUFFER;
    }

    while (true)
    {
        const int nalUnitType = *nextSlice;
        switch (static_cast<NALUnit::NALType>(nalUnitType & 0x1f))
        {
        case NALUnit::NALType::nuSliceIDR:
        case NALUnit::NALType::nuSliceNonIDR:
        case NALUnit::NALType::nuSliceA:
        case NALUnit::NALType::nuSliceB:
        case NALUnit::NALType::nuSliceC:
        case NALUnit::NALType::nuSliceExt:
            if (slice.deserializeSliceType(nextSlice, m_bufEnd) != 0)
            {
                return m_eof ? 0 : NOT_ENOUGH_BUFFER;
            }

            if (slice.first_mb_in_slice == 0)
            {
                m_nextFrameFound = true;
                m_nextFrameIdr = slice.isIDR();
                return 0;  // next frame found
            }
            m_pict_type = (std::max)(m_pict_type, sliceTypeToPictType(slice.slice_type));
            break;
        default:
            break;
        }
        nextSlice = NALUnit::findNextNAL(nextSlice, m_bufEnd);
        if (nextSlice == m_bufEnd)
        {
            return m_eof ? 0 : NOT_ENOUGH_BUFFER;
        }
    }
}